

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedDecimalInteger
          (ParserImpl *this,uint64 *value,uint64 max_value)

{
  string *text;
  char *pcVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = &bStack_58;
  if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
    text = &(this->tokenizer_).current_.text;
    if ((((this->tokenizer_).current_.text._M_string_length < 2) ||
        (pcVar1 = (text->_M_dataplus)._M_p, *pcVar1 != '0')) ||
       (((pcVar1[1] & 0xdfU) != 0x58 && ((pcVar1[1] & 0xf8U) != 0x30)))) {
      bVar2 = io::Tokenizer::ParseInteger(text,max_value,value);
      if (bVar2) {
        io::Tokenizer::Next(&this->tokenizer_);
        return true;
      }
      std::operator+(&local_38,"Integer out of range (",text);
      std::operator+(&bStack_58,&local_38,")");
      ReportError(this,&bStack_58);
      std::__cxx11::string::~string((string *)&bStack_58);
      this_00 = &local_38;
    }
    else {
      std::operator+(&bStack_58,"Expect a decimal number, got: ",text);
      ReportError(this,&bStack_58);
      this_00 = &bStack_58;
    }
  }
  else {
    std::operator+(&bStack_58,"Expected integer, got: ",&(this->tokenizer_).current_.text);
    ReportError(this,&bStack_58);
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool ConsumeUnsignedDecimalInteger(uint64* value, uint64 max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError("Expected integer, got: " + tokenizer_.current().text);
      return false;
    }

    const string& text = tokenizer_.current().text;
    if (IsHexNumber(text) || IsOctNumber(text)) {
      ReportError("Expect a decimal number, got: " + text);
      return false;
    }

    if (!io::Tokenizer::ParseInteger(text, max_value, value)) {
      ReportError("Integer out of range (" + text + ")");
      return false;
    }

    tokenizer_.Next();
    return true;
  }